

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P33x.h
# Opt level: O3

int ConnectP33x(P33X *pP33x,char *szCfgFilePath)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  char line [256];
  byte local_138;
  char local_137;
  
  memset(pP33x->szCfgFilePath,0,0x100);
  sprintf(pP33x->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(&local_138,0,0x100);
    memset(pP33x->szDevPath + 5,0,0xfb);
    builtin_strncpy(pP33x->szDevPath,"COM1",5);
    pP33x->BaudRate = 0x2580;
    pP33x->timeout = 1000;
    pP33x->threadperiod = 100;
    pP33x->bSaveRawData = 1;
    pP33x->PressureRef = 1.0;
    pP33x->WaterDensity = 1000.0;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      pcVar2 = "Configuration file not found.";
    }
    else {
      while( true ) {
        while (pcVar2 = fgets((char *)&local_138,0x100,__stream), 0x24 < local_138) {
          if (local_138 == 0x25) goto LAB_00114cab;
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_00114cc3;
        }
        if (local_138 != 0x23) break;
LAB_00114cab:
        if (pcVar2 == (char *)0x0) goto LAB_00114cc8;
      }
      if (local_138 == 0x24) goto LAB_00114cc8;
LAB_00114cc3:
      if (pcVar2 == (char *)0x0) {
LAB_00114cc8:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%255s",pP33x->szDevPath);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_138,0x100,__stream), 0x24 < local_138) {
          if (local_138 == 0x25) goto LAB_00114d37;
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_00114d43;
        }
        if (local_138 != 0x23) break;
LAB_00114d37:
        if (pcVar2 == (char *)0x0) goto LAB_00114d48;
      }
      if (local_138 == 0x24) goto LAB_00114d48;
LAB_00114d43:
      if (pcVar2 == (char *)0x0) {
LAB_00114d48:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pP33x->BaudRate);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_138,0x100,__stream), 0x24 < local_138) {
          if (local_138 == 0x25) goto LAB_00114db7;
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_00114dc3;
        }
        if (local_138 != 0x23) break;
LAB_00114db7:
        if (pcVar2 == (char *)0x0) goto LAB_00114dc8;
      }
      if (local_138 == 0x24) goto LAB_00114dc8;
LAB_00114dc3:
      if (pcVar2 == (char *)0x0) {
LAB_00114dc8:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pP33x->timeout);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_138,0x100,__stream), 0x24 < local_138) {
          if (local_138 == 0x25) goto LAB_00114e37;
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_00114e43;
        }
        if (local_138 != 0x23) break;
LAB_00114e37:
        if (pcVar2 == (char *)0x0) goto LAB_00114e48;
      }
      if (local_138 == 0x24) goto LAB_00114e48;
LAB_00114e43:
      if (pcVar2 == (char *)0x0) {
LAB_00114e48:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pP33x->threadperiod);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_138,0x100,__stream), 0x24 < local_138) {
          if (local_138 == 0x25) goto LAB_00114eb9;
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_00114ec5;
        }
        if (local_138 != 0x23) break;
LAB_00114eb9:
        if (pcVar2 == (char *)0x0) goto LAB_00114eca;
      }
      if (local_138 == 0x24) goto LAB_00114eca;
LAB_00114ec5:
      if (pcVar2 == (char *)0x0) {
LAB_00114eca:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pP33x->bSaveRawData);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_138,0x100,__stream), 0x24 < local_138) {
          if (local_138 == 0x25) goto LAB_00114f3b;
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_00114f47;
        }
        if (local_138 != 0x23) break;
LAB_00114f3b:
        if (pcVar2 == (char *)0x0) goto LAB_00114f4c;
      }
      if (local_138 == 0x24) goto LAB_00114f4c;
LAB_00114f47:
      if (pcVar2 == (char *)0x0) {
LAB_00114f4c:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%lf",&pP33x->PressureRef);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_138,0x100,__stream), 0x24 < local_138) {
          if (local_138 == 0x25) goto LAB_00114fbd;
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_00114fc9;
        }
        if (local_138 != 0x23) break;
LAB_00114fbd:
        if (pcVar2 == (char *)0x0) goto LAB_00114fce;
      }
      if (local_138 == 0x24) goto LAB_00114fce;
LAB_00114fc9:
      if (pcVar2 == (char *)0x0) {
LAB_00114fce:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%lf",&pP33x->WaterDensity);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      iVar1 = fclose(__stream);
      if (iVar1 == 0) goto LAB_0011501b;
      pcVar2 = "fclose() failed.";
    }
    puts(pcVar2);
  }
LAB_0011501b:
  if (pP33x->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    pP33x->threadperiod = 100;
  }
  pP33x->LastPressure = 0.0;
  pP33x->LastTemperature = 0.0;
  iVar1 = OpenRS232Port(&pP33x->RS232Port,pP33x->szDevPath);
  if (iVar1 != 0) {
    puts("Unable to connect to a P33x.");
    return 1;
  }
  iVar1 = (pP33x->RS232Port).DevType;
  if (3 < iVar1 - 1U) {
    if ((iVar1 != 0) ||
       (iVar1 = SetOptionsComputerRS232Port
                          ((pP33x->RS232Port).hDev,pP33x->BaudRate,'\0',0,'\b','\0',pP33x->timeout),
       iVar1 != 0)) {
      pcVar2 = "Unable to connect to a P33x.";
      goto LAB_001150bb;
    }
    tcflush(*(int *)&(pP33x->RS232Port).hDev,2);
  }
  iVar1 = InitP33x(pP33x);
  if (iVar1 == 0) {
    puts("P33x connected.");
    return 0;
  }
  pcVar2 = "Unable to connect to P33x.";
LAB_001150bb:
  puts(pcVar2);
  CloseRS232Port(&pP33x->RS232Port);
  return 1;
}

Assistant:

inline int ConnectP33x(P33X* pP33x, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];

	memset(pP33x->szCfgFilePath, 0, sizeof(pP33x->szCfgFilePath));
	sprintf(pP33x->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pP33x->szDevPath, 0, sizeof(pP33x->szDevPath));
		sprintf(pP33x->szDevPath, "COM1");
		pP33x->BaudRate = 9600;
		pP33x->timeout = 1000;
		pP33x->threadperiod = 100;
		pP33x->bSaveRawData = 1;
		pP33x->PressureRef = 1;
		pP33x->WaterDensity = 1000;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pP33x->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pP33x->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pP33x->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pP33x->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pP33x->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pP33x->PressureRef) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pP33x->WaterDensity) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pP33x->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pP33x->threadperiod = 100;
	}

	// Used to save raw data, should be handled specifically...
	//pP33x->pfSaveFile = NULL;

	pP33x->LastPressure = 0;
	pP33x->LastTemperature = 0;

	if (OpenRS232Port(&pP33x->RS232Port, pP33x->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a P33x.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pP33x->RS232Port, pP33x->BaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)pP33x->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a P33x.\n");
		CloseRS232Port(&pP33x->RS232Port);
		return EXIT_FAILURE;
	}

	if (InitP33x(pP33x) != EXIT_SUCCESS)
	{
		printf("Unable to connect to P33x.\n");
		CloseRS232Port(&pP33x->RS232Port);
		return EXIT_FAILURE;
	}

	printf("P33x connected.\n");

	return EXIT_SUCCESS;
}